

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.hpp
# Opt level: O1

void __thiscall
duckdb::BaseScanner::Process<duckdb::SkipResult>(BaseScanner *this,SkipResult *result)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  idx_t *piVar1;
  ulong uVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  CSVState CVar6;
  CSVState CVar7;
  idx_t iVar8;
  CSVStates *pCVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  CSVStateMachine *pCVar13;
  CSVBufferHandle *pCVar14;
  idx_t iVar15;
  ulong uVar16;
  idx_t *piVar17;
  ulong uVar18;
  idx_t iVar19;
  idx_t iVar20;
  
  this_00 = &this->state_machine;
  pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  cVar3 = (pCVar13->dialect_options).state_machine_options.escape.value;
  pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  if ((((pCVar13->state_machine_options).strict_mode.value == true) &&
      (pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
      (pCVar13->state_machine_options).strict_mode.set_by_user == true)) &&
     (pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
     (pCVar13->state_machine_options).new_line.value == CARRY_ON)) {
    pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    cVar4 = (pCVar13->state_machine_options).new_line.set_by_user;
  }
  else {
    cVar4 = '\0';
  }
  piVar1 = &(this->iterator).pos.buffer_pos;
  iVar8 = (this->iterator).pos.buffer_pos;
  if ((this->iterator).is_set == true) {
    iVar20 = (this->iterator).boundary.end_pos;
    pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
    if (iVar20 <= pCVar14->actual_size) goto LAB_00d2910d;
  }
  pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
  iVar20 = pCVar14->actual_size;
LAB_00d2910d:
  uVar18 = *piVar1;
  if (uVar18 < iVar20) {
    uVar2 = iVar20 - 1;
    do {
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      iVar19 = (this->iterator).pos.buffer_pos;
      bVar5 = this->buffer_handle_ptr[iVar19];
      CVar6 = (this->states).states[1];
      (this->states).states[0] = CVar6;
      CVar7 = pCVar13->transition_array->state_machine[bVar5][CVar6];
      (this->states).states[1] = CVar7;
      switch(CVar7) {
      case STANDARD:
        iVar15 = iVar19 + 1;
        *piVar1 = iVar15;
        uVar18 = iVar19 + 9;
        while (uVar18 < iVar20) {
          uVar18 = *(ulong *)(this->buffer_handle_ptr + iVar15);
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar16 = pCVar13->transition_array->delimiter;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar10 = pCVar13->transition_array->new_line;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar11 = pCVar13->transition_array->carriage_return;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar12 = pCVar13->transition_array->escape;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar18 = (uVar18 ^ pCVar13->transition_array->comment) &
                   (uVar12 ^ uVar18) & (uVar11 ^ uVar18) & (uVar10 ^ uVar18) & (uVar16 ^ uVar18);
          if ((~(0x101010101010100 - uVar18 | uVar18) & 0x8080808080808080) != 0) break;
          iVar19 = *piVar1;
          iVar15 = iVar19 + 8;
          *piVar1 = iVar15;
          uVar18 = iVar19 + 0x10;
        }
        pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar18 = (this->iterator).pos.buffer_pos;
        while ((uVar18 < uVar2 &&
               (pCVar13->transition_array->skip_standard[(byte)this->buffer_handle_ptr[uVar18]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar18 + 1;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar18 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_00d29583;
      case RECORD_SEPARATOR:
        if (CVar6 == NOT_SET) {
LAB_00d293ea:
          if ((((result->super_ScannerResult).state_machine)->dialect_options).num_cols == 1) {
LAB_00d29562:
            uVar18 = result->row_count + 1;
            result->row_count = uVar18;
            if (result->rows_to_skip <= uVar18) {
LAB_00d295de:
              (this->iterator).pos.buffer_pos = iVar19 + 1;
              this->bytes_read = (iVar19 + 1) - iVar8;
              this->lines_read = this->lines_read + 1;
              return;
            }
          }
        }
        else {
          if (CVar6 == CARRIAGE_RETURN) break;
          if (CVar6 == RECORD_SEPARATOR) goto LAB_00d293ea;
          if ((result->super_ScannerResult).comment != true) goto LAB_00d29562;
          uVar16 = result->row_count + 1;
          result->row_count = uVar16;
          uVar18 = result->rows_to_skip;
          (result->super_ScannerResult).comment = false;
          if (uVar18 <= uVar16) goto LAB_00d295de;
        }
        this->lines_read = this->lines_read + 1;
        break;
      case CARRIAGE_RETURN:
        if (CVar6 == NOT_SET) {
LAB_00d293a7:
          if ((((result->super_ScannerResult).state_machine)->dialect_options).num_cols == 1) {
LAB_00d293b9:
            uVar18 = result->row_count + 1;
            result->row_count = uVar18;
            if (result->rows_to_skip <= uVar18) goto LAB_00d295de;
          }
        }
        else if (CVar6 != CARRIAGE_RETURN) {
          if (CVar6 == RECORD_SEPARATOR) goto LAB_00d293a7;
          if ((result->super_ScannerResult).comment == true) {
            uVar16 = result->row_count + 1;
            result->row_count = uVar16;
            uVar18 = result->rows_to_skip;
            (result->super_ScannerResult).comment = false;
            if (uVar18 <= uVar16) goto LAB_00d295de;
          }
          else if (cVar4 == '\0') goto LAB_00d293b9;
        }
        *piVar1 = iVar19 + 1;
        iVar19 = this->lines_read;
        piVar17 = &this->lines_read;
        goto LAB_00d2957d;
      case QUOTED:
        if (((CVar6 == MAYBE_QUOTED) || (CVar6 == UNQUOTED)) && (cVar3 != '\0')) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        this->ever_quoted = true;
        if ((result->super_ScannerResult).quoted == false) {
          (result->super_ScannerResult).quoted_position = iVar19;
        }
        (result->super_ScannerResult).quoted = true;
        (result->super_ScannerResult).unquoted = true;
        iVar15 = iVar19 + 1;
        *piVar1 = iVar15;
        uVar18 = iVar19 + 9;
        while (uVar18 < iVar20) {
          uVar18 = *(ulong *)(this->buffer_handle_ptr + iVar15);
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar16 = pCVar13->transition_array->quote;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar18 = (uVar18 ^ pCVar13->transition_array->escape) & (uVar16 ^ uVar18);
          if ((~(0x101010101010100 - uVar18 | uVar18) & 0x8080808080808080) != 0) break;
          iVar19 = *piVar1;
          iVar15 = iVar19 + 8;
          *piVar1 = iVar15;
          uVar18 = iVar19 + 0x10;
        }
        pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar18 = (this->iterator).pos.buffer_pos;
        while ((uVar18 < uVar2 &&
               (pCVar13->transition_array->skip_quoted[(byte)this->buffer_handle_ptr[uVar18]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar18 + 1;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar18 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_00d29583;
      case UNQUOTED:
        if (CVar6 == MAYBE_QUOTED) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        pCVar9 = (result->super_ScannerResult).states;
        if (((pCVar9->states[0] == UNQUOTED) && (pCVar9->states[1] == UNQUOTED)) &&
           ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
            escape.value != '\0')) {
          (result->super_ScannerResult).escaped = true;
        }
        (result->super_ScannerResult).quoted = true;
        break;
      case ESCAPE:
      case UNQUOTED_ESCAPE:
      case ESCAPED_RETURN:
        (result->super_ScannerResult).escaped = true;
        this->ever_escaped = true;
        break;
      case INVALID:
        (this->iterator).pos.buffer_pos = iVar19 + 1;
        this->bytes_read = (iVar19 + 1) - iVar8;
        return;
      case COMMENT:
        (result->super_ScannerResult).comment = true;
        iVar15 = iVar19 + 1;
        *piVar1 = iVar15;
        uVar18 = iVar19 + 9;
        while (uVar18 < iVar20) {
          uVar18 = *(ulong *)(this->buffer_handle_ptr + iVar15);
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar16 = pCVar13->transition_array->new_line;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar18 = (uVar18 ^ pCVar13->transition_array->carriage_return) & (uVar16 ^ uVar18);
          if ((~(0x101010101010100 - uVar18 | uVar18) & 0x8080808080808080) != 0) break;
          iVar19 = *piVar1;
          iVar15 = iVar19 + 8;
          *piVar1 = iVar15;
          uVar18 = iVar19 + 0x10;
        }
        pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar18 = (this->iterator).pos.buffer_pos;
        while ((uVar18 < uVar2 &&
               (pCVar13->transition_array->skip_comment[(byte)this->buffer_handle_ptr[uVar18]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar18 + 1;
          pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar18 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_00d29583;
      }
      piVar17 = piVar1;
LAB_00d2957d:
      *piVar17 = iVar19 + 1;
LAB_00d29583:
      uVar18 = *piVar1;
    } while (uVar18 < iVar20);
  }
  this->bytes_read = uVar18 - iVar8;
  return;
}

Assistant:

void Process(T &result) {
		idx_t to_pos;
		const bool has_escaped_value = state_machine->dialect_options.state_machine_options.escape != '\0';
		const bool only_rn_newlines =
		    state_machine->state_machine_options.strict_mode.GetValue() &&
		    state_machine->state_machine_options.strict_mode.IsSetByUser() &&
		    state_machine->state_machine_options.new_line.GetValue() == NewLineIdentifier::CARRY_ON &&
		    state_machine->state_machine_options.new_line.IsSetByUser();
		const idx_t start_pos = iterator.pos.buffer_pos;
		if (iterator.IsBoundarySet()) {
			to_pos = iterator.GetEndPos();
			if (to_pos > cur_buffer_handle->actual_size) {
				to_pos = cur_buffer_handle->actual_size;
			}
		} else {
			to_pos = cur_buffer_handle->actual_size;
		}
		while (iterator.pos.buffer_pos < to_pos) {
			state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
			switch (states.states[1]) {
			case CSVState::INVALID:
				T::InvalidState(result);
				iterator.pos.buffer_pos++;
				bytes_read = iterator.pos.buffer_pos - start_pos;
				return;
			case CSVState::RECORD_SEPARATOR:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
					lines_read++;

				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
					lines_read++;
				}
				iterator.pos.buffer_pos++;
				break;
			case CSVState::CARRIAGE_RETURN:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else if (!only_rn_newlines) {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				break;
			case CSVState::DELIMITER:
				T::AddValue(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::QUOTED: {
				if ((states.states[0] == CSVState::UNQUOTED || states.states[0] == CSVState::MAYBE_QUOTED) &&
				    has_escaped_value) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				ever_quoted = true;
				T::SetQuoted(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.quote) &
					                     (value ^ state_machine->transition_array.escape))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}

				while (state_machine->transition_array
				           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
			} break;
			case CSVState::UNQUOTED: {
				if (states.states[0] == CSVState::MAYBE_QUOTED) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				T::SetUnquoted(result);
				iterator.pos.buffer_pos++;
				break;
			}
			case CSVState::ESCAPE:
			case CSVState::UNQUOTED_ESCAPE:
			case CSVState::ESCAPED_RETURN:
				T::SetEscaped(result);
				ever_escaped = true;
				iterator.pos.buffer_pos++;
				break;
			case CSVState::STANDARD: {
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.delimiter) &
					                     (value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return) &
					                     (value ^ state_machine->transition_array.escape) &
					                     (value ^ state_machine->transition_array.comment))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			case CSVState::QUOTED_NEW_LINE:
				T::QuotedNewLine(result);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::COMMENT: {
				T::SetComment(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_comment[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			default:
				iterator.pos.buffer_pos++;
				break;
			}
		}
		bytes_read = iterator.pos.buffer_pos - start_pos;
	}